

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_piz.c
# Opt level: O0

void wdec14_4(uint16_t *px,uint16_t *p01,uint16_t *p10,uint16_t *p11)

{
  ushort uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  short sVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  int i11;
  int i01;
  int i10;
  int i00;
  int di;
  int ci;
  int bi;
  int ai;
  int16_t d;
  int16_t c;
  int16_t b;
  int16_t a;
  uint16_t *p11_local;
  uint16_t *p10_local;
  uint16_t *p01_local;
  uint16_t *px_local;
  
  uVar1 = *p10;
  uVar6 = (uint)(short)*p11;
  sVar4 = *px + (uVar1 & 1) + ((short)uVar1 >> 1);
  iVar7 = (int)(short)*p01 + (uVar6 & 1) + ((int)uVar6 >> 1);
  uVar2 = sVar4 + ((ushort)iVar7 & 1) + (short)(iVar7 >> 1);
  uVar5 = (ushort)(iVar7 - uVar6);
  uVar3 = (sVar4 - uVar1) + (uVar5 & 1) + (short)((int)(iVar7 - uVar6) >> 1);
  *px = uVar2;
  *p01 = uVar2 - (ushort)iVar7;
  *p10 = uVar3;
  *p11 = uVar3 - uVar5;
  return;
}

Assistant:

static inline void
wdec14_4 (uint16_t* px, uint16_t* p01, uint16_t* p10, uint16_t* p11)
{
    /* pre swap
     * px, p01, p10, p11
     * px -> a
     * p10 -> b
     * p01 -> c
     * p11 -> d
     * */
    int16_t a = (int16_t) *px;
    int16_t b = (int16_t) *p10;
    int16_t c = (int16_t) *p01;
    int16_t d = (int16_t) *p11;

    int ai = (int) a;
    int bi = (int) b;
    int ci = (int) c;
    int di = (int) d;

    int i00 = ai + (bi & 1) + (bi >> 1);
    int i10 = i00 - bi;
    int i01 = ci + (di & 1) + (di >> 1);
    int i11 = i01 - di;

    ai = i00 + (i01 & 1) + (i01 >> 1);
    bi = ai - i01;
    ci = i10 + (i11 & 1) + (i11 >> 1);
    di = ci - i11;

    /* different output order */
    /* px, p01, p10, p11 */
    *px  = (uint16_t) ai;
    *p01 = (uint16_t) bi;
    *p10 = (uint16_t) ci;
    *p11 = (uint16_t) di;
}